

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O1

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _c;
  int _w;
  int _h;
  size_t _elemsize;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  _c = bottom_blob->c;
  uVar1 = this->group;
  iVar3 = -100;
  if (_c % (int)uVar1 == 0) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    uVar4 = _c / (int)uVar1;
    if (this->reverse == 0) {
      uVar4 = uVar1;
    }
    uVar1 = _c / (int)uVar4;
    Mat::create(top_blob,_w,_h,_c,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (0 < (int)uVar4) {
        lVar6 = 0;
        uVar8 = 0;
        do {
          uVar2 = (ulong)uVar1;
          lVar5 = lVar6;
          uVar7 = uVar8;
          if (0 < (int)uVar1) {
            do {
              memcpy((void *)(top_blob->cstep * uVar7 * top_blob->elemsize + (long)top_blob->data),
                     (void *)(bottom_blob->cstep * lVar5 * bottom_blob->elemsize +
                             (long)bottom_blob->data),(long)_h * (long)_w * _elemsize);
              uVar7 = uVar7 + uVar4;
              lVar5 = lVar5 + 1;
              uVar2 = uVar2 - 1;
            } while (uVar2 != 0);
          }
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + (ulong)uVar1;
        } while (uVar8 != uVar4);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0)
    {
        // reject invalid group
        return -100;
    }

    int _group = reverse ? channels / group : group;
    int channels_per_group = channels / _group;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = (size_t)w * h * elemsize;
    for (int i = 0; i < _group; i++)
    {
        for (int j = 0; j < channels_per_group; j++)
        {
            int src_q = channels_per_group * i + j;
            int dst_q = _group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }

    return 0;
}